

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O1

void const_array_suite::pop_front(void)

{
  ulong uVar1;
  basic_iterator<const_int> first_end;
  basic_iterator<const_int> first_end_00;
  reference piVar2;
  ulong uVar3;
  ulong uVar4;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  basic_iterator<const_int> first_begin;
  basic_iterator<const_int> first_begin_00;
  vector<int,_std::allocator<int>_> expect;
  circular_view<const_int,_18446744073709551615UL> span;
  int array [4];
  allocator_type local_b1;
  vector<int,_std::allocator<int>_> local_b0;
  circular_view<const_int,_18446744073709551615UL> local_98;
  int local_74 [3];
  circular_view<const_int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  view_pointer local_58;
  size_type sStack_50;
  type local_48 [6];
  
  local_98.member.data = local_48;
  local_48[0] = 0xb;
  local_48[1] = 0x16;
  local_48[2] = 0x21;
  local_48[3] = 0;
  local_98.member.cap = 3;
  local_98.member.size = 3;
  local_98.member.next = 3;
  local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x3;
  local_74[0] = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x7fd,"void const_array_suite::pop_front()",&local_b0,local_74);
  local_74[0] = 0xb;
  local_74[1] = 0x16;
  local_74[2] = 0x21;
  __l._M_len = 3;
  __l._M_array = local_74;
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,__l,&local_b1);
  uVar1 = local_98.member.cap * 2;
  uVar3 = uVar1 - (local_98.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_98.member.next - local_98.member.size;
  }
  else {
    uVar4 = (local_98.member.next - local_98.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_50 = uVar1 - 1 & local_98.member.next;
  }
  else {
    sStack_50 = local_98.member.next % uVar1;
  }
  local_58 = &local_98;
  first_end.current = sStack_50;
  first_end.parent = local_58;
  first_begin.current = uVar4;
  first_begin.parent = local_58;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int_const,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x801,"void const_array_suite::pop_front()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  piVar2 = vista::circular_view<const_int,_18446744073709551615UL>::front(&local_98);
  vista::circular_view<const_int,_18446744073709551615UL>::remove_front(&local_98,1);
  local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,*piVar2);
  local_74[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.pop_front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x803,"void const_array_suite::pop_front()",&local_b0,local_74);
  local_74[0] = 0x16;
  local_74[1] = 0x21;
  __l_00._M_len = 2;
  __l_00._M_array = local_74;
  std::vector<int,_std::allocator<int>_>::vector(&local_b0,__l_00,&local_b1);
  uVar1 = local_98.member.cap * 2;
  uVar3 = uVar1 - (local_98.member.cap & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  uVar3 = ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (uVar3 >> 0x38 < 2) {
    uVar4 = uVar1 - 1 & local_98.member.next - local_98.member.size;
  }
  else {
    uVar4 = (local_98.member.next - local_98.member.size) % uVar1;
  }
  if ((byte)(uVar3 >> 0x38) < 2) {
    sStack_60 = uVar1 - 1 & local_98.member.next;
  }
  else {
    sStack_60 = local_98.member.next % uVar1;
  }
  first_end_00.current = sStack_60;
  first_end_00.parent = &local_98;
  first_begin_00.current = uVar4;
  first_begin_00.parent = &local_98;
  local_68 = &local_98;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int_const,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x807,"void const_array_suite::pop_front()",first_begin_00,first_end_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void pop_front()
{
    int array[4] = { 11, 22, 33 };
    circular_view<const int> span(&array[0], &array[3],
                                   &array[0], 3);
    BOOST_TEST_EQ(span.capacity(), 3);
    {
        std::vector<int> expect = { 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    BOOST_TEST_EQ(span.pop_front(), 11);
    {
        std::vector<int> expect = { 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}